

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int __thiscall
CCharmapToUniUcs2Little::mapchar(CCharmapToUniUcs2Little *this,wchar_t *ch,char **p,size_t *len)

{
  ulong uVar1;
  byte *pbVar2;
  size_t *len_local;
  char **p_local;
  wchar_t *ch_local;
  CCharmapToUniUcs2Little *this_local;
  uint local_4;
  
  uVar1 = *len;
  if (1 < uVar1) {
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    *ch = (uint)*pbVar2;
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    *ch = (uint)*pbVar2 << 8 | *ch;
    *len = *len - 2;
  }
  local_4 = (uint)(1 < uVar1);
  return local_4;
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 2)
        {
            /* map the character */
            ch = (unsigned char)*p++;
            ch |= ((unsigned char)*p++) << 8;

            /* deduct it from the length */
            len -= 2;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }